

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_unsubscribe(subscription_s *s)

{
  channel_s *obj;
  anon_struct_264_5_f7cd9697 *set;
  int iVar1;
  uint64_t hash_value;
  uint64_t hashed;
  fio_collection_s *c;
  uint8_t removed;
  channel_s *ch;
  subscription_s *s_local;
  
  if (s != (subscription_s *)0x0) {
    iVar1 = fio_trylock(&s->unsubscribed);
    if (iVar1 == 0) {
      fio_lock(&s->lock);
      obj = s->parent;
      c._7_1_ = false;
      fio_lock(&obj->lock);
      fio_ls_embd_remove(&s->node);
      iVar1 = fio_ls_embd_is_empty(&obj->subscriptions);
      if (iVar1 != 0) {
        set = (anon_struct_264_5_f7cd9697 *)obj->parent;
        hash_value = fio_siphash13(obj->name,obj->name_len,0x1bac58,0x1bac58);
        fio_lock(&(set->filters).lock);
        iVar1 = fio_ls_embd_is_empty(&obj->subscriptions);
        if (iVar1 != 0) {
          fio_ch_set_remove((fio_ch_set_s *)set,hash_value,obj,(channel_s **)0x0);
        }
        c._7_1_ = iVar1 != 0 && set != &fio_postoffice;
        fio_unlock(&(set->filters).lock);
      }
      fio_unlock(&obj->lock);
      if (c._7_1_) {
        fio_pubsub_on_channel_destroy(obj);
      }
      s->on_message = (_func_void_fio_msg_s_ptr *)0x0;
      fio_unlock(&s->lock);
    }
    fio_subscription_free(s);
  }
  return;
}

Assistant:

void fio_unsubscribe(subscription_s *s) {
  if (!s)
    return;
  if (fio_trylock(&s->unsubscribed))
    goto finish;
  fio_lock(&s->lock);
  channel_s *ch = s->parent;
  uint8_t removed = 0;
  fio_lock(&ch->lock);
  fio_ls_embd_remove(&s->node);
  /* check if channel is done for */
  if (fio_ls_embd_is_empty(&ch->subscriptions)) {
    fio_collection_s *c = ch->parent;
    uint64_t hashed = FIO_HASH_FN(
        ch->name, ch->name_len, &fio_postoffice.pubsub, &fio_postoffice.pubsub);
    /* lock collection */
    fio_lock(&c->lock);
    /* test again within lock */
    if (fio_ls_embd_is_empty(&ch->subscriptions)) {
      fio_ch_set_remove(&c->channels, hashed, ch, NULL);
      removed = (c != &fio_postoffice.filters);
    }
    fio_unlock(&c->lock);
  }
  fio_unlock(&ch->lock);
  if (removed) {
    fio_pubsub_on_channel_destroy(ch);
  }

  /* promise the subscription will be inactive */
  s->on_message = NULL;
  fio_unlock(&s->lock);
finish:
  fio_subscription_free(s);
}